

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIOption.h
# Opt level: O3

void __thiscall libchess::UCIOption<int>::set_option(UCIOption<int> *this,value_type *value)

{
  undefined8 uVar1;
  
  this->value_ = *value;
  if ((this->handler_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->handler_)._M_invoker)((_Any_data *)&this->handler_,value);
    return;
  }
  uVar1 = std::__throw_bad_function_call();
  __clang_call_terminate(uVar1);
}

Assistant:

virtual void set_option(const value_type& value) noexcept {
        value_ = value;
        handler_(value);
    }